

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renaming.cpp
# Opt level: O2

TypedTermList __thiscall Kernel::Renaming::normalize(Renaming *this,TypedTermList l)

{
  TermList t;
  TermList TVar1;
  TypedTermList TVar2;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> n;
  Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_28;
  
  if (((ulong)this & 3) == 0) {
    t._content = (uint64_t)normalize((Term *)this);
    TVar1 = SortHelper::getResultSort((Term *)t._content);
  }
  else {
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
              (&local_28);
    normalizeVariables((Renaming *)
                       local_28._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,(TermList)this
                      );
    normalizeVariables((Renaming *)
                       local_28._self._M_t.
                       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                       .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,
                       l.super_TermList._content);
    t = apply((Renaming *)
              local_28._self._M_t.
              super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
              super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
              super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,(TermList)this);
    TVar1 = apply((Renaming *)
                  local_28._self._M_t.
                  super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>
                  .super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl,
                  l.super_TermList._content);
    Lib::Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
              (&local_28);
  }
  TVar2._sort._content = TVar1._content;
  TVar2.super_TermList._content = t._content;
  return TVar2;
}

Assistant:

TypedTermList Renaming::normalize(TypedTermList l)
{
  if (l.isTerm()) {
    return TypedTermList(normalize(l.term()));
  } else {
    Recycled<Renaming> n;
    n->normalizeVariables(TermList(l));
    n->normalizeVariables(l.sort());
    return TypedTermList(n->apply(TermList(l)), n->apply(l.sort()));
  }
}